

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueInt8::read(PLYValueInt8 *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  
  cVar1 = std::streambuf::sbumpc();
  this->value = cVar1;
  return (ssize_t)this;
}

Assistant:

void read(std::streambuf *in) { value=static_cast<char>(in->sbumpc()); }